

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_libapi.cpp
# Opt level: O0

ze_result_t
zetMetricQueryGetData(zet_metric_query_handle_t hMetricQuery,size_t *pRawDataSize,uint8_t *pRawData)

{
  zet_pfnMetricQueryGetData_t p_Var1;
  __pointer_type p_Var2;
  zet_pfnMetricQueryGetData_t pfnGetData;
  uint8_t *pRawData_local;
  size_t *pRawDataSize_local;
  zet_metric_query_handle_t hMetricQuery_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zet_dditable_t_*>::load
                       ((atomic<_zet_dditable_t_*> *)(ze_lib::context + 0x18),memory_order_seq_cst);
    p_Var1 = (p_Var2->MetricQuery).pfnGetData;
    if (p_Var1 == (zet_pfnMetricQueryGetData_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hMetricQuery_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hMetricQuery_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hMetricQuery_local._4_4_ = (*p_Var1)(hMetricQuery,pRawDataSize,pRawData);
    }
  }
  else {
    hMetricQuery_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hMetricQuery_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zetMetricQueryGetData(
    zet_metric_query_handle_t hMetricQuery,         ///< [in] handle of the metric query
    size_t* pRawDataSize,                           ///< [in,out] pointer to size in bytes of raw data requested to read.
                                                    ///< if size is zero, then the driver will update the value with the total
                                                    ///< size in bytes needed for all reports available.
                                                    ///< if size is non-zero, then driver will only retrieve the number of
                                                    ///< reports that fit into the buffer.
                                                    ///< if size is larger than size needed for all reports, then driver will
                                                    ///< update the value with the actual size needed.
    uint8_t* pRawData                               ///< [in,out][optional][range(0, *pRawDataSize)] buffer containing query
                                                    ///< reports in raw format
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zet_pfnMetricQueryGetData_t pfnGetData = [&result] {
        auto pfnGetData = ze_lib::context->zetDdiTable.load()->MetricQuery.pfnGetData;
        if( nullptr == pfnGetData ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetData;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetData( hMetricQuery, pRawDataSize, pRawData );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetData = ze_lib::context->zetDdiTable.load()->MetricQuery.pfnGetData;
    if( nullptr == pfnGetData ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetData( hMetricQuery, pRawDataSize, pRawData );
    #endif
}